

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeAdvancedBlend(FragmentProcessor *this,BlendEquationAdvanced equation)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  long lVar7;
  Vec3 *pVVar8;
  SampleData *sample;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar19;
  undefined1 auVar18 [16];
  float fVar20;
  undefined1 auVar21 [16];
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 local_88;
  float local_80;
  float local_78;
  float local_74;
  float local_70 [4];
  Vec3 local_60;
  Vec3 local_50;
  float local_44;
  advblend local_40 [12];
  float local_34;
  
  lVar6 = 0;
  do {
    if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
        '\x01') {
      fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 0xc)
      ;
      fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 0xc)
      ;
      fVar12 = (1.0 - fVar13) * fVar20;
      fVar15 = (1.0 - fVar20) * fVar13;
      fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8);
      fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8);
      pfVar1 = (float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6);
      uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6);
      *(ulong *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6) =
           CONCAT44(fVar12 * pfVar1[1] + fVar15 * (float)((ulong)uVar2 >> 0x20),
                    fVar12 * *pfVar1 + fVar15 * (float)uVar2);
      *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8) =
           fVar14 * fVar12 + fVar17 * fVar15;
      *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4) =
           fVar20 * fVar13;
      *(float *)((long)this->m_sampleRegister[0].signedValue.m_data + lVar6 + -4) =
           fVar12 + fVar20 * fVar13 + fVar15;
    }
    lVar6 = lVar6 + 0x84;
  } while (lVar6 != 0x2100);
  switch(equation) {
  case BLENDEQUATION_ADVANCED_MULTIPLY:
    lVar6 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8)
        ;
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8)
        ;
        fVar14 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6)
        ;
        uVar4 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6)
        ;
        uVar3 = *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar20 * (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar2 >> 0x20) +
                      (float)((ulong)uVar3 >> 0x20),
                      fVar20 * (float)uVar4 * (float)uVar2 + (float)uVar3);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             fVar13 * fVar17 * fVar20 + fVar14;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x2100);
    break;
  case BLENDEQUATION_ADVANCED_SCREEN:
    lVar6 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8)
        ;
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8)
        ;
        fVar14 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6)
        ;
        fVar12 = (float)uVar2;
        fVar15 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6)
        ;
        fVar16 = (float)uVar2;
        fVar19 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar20 * ((fVar15 + fVar19) - fVar15 * fVar19) + (float)((ulong)uVar2 >> 0x20)
                      ,fVar20 * ((fVar12 + fVar16) - fVar12 * fVar16) + (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             ((fVar13 + fVar17) - fVar13 * fVar17) * fVar20 + fVar14;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x2100);
    break;
  case BLENDEQUATION_ADVANCED_OVERLAY:
    lVar6 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x5c);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        if (fVar13 <= 0.5) {
          fVar13 = (fVar20 + fVar20) * fVar13;
        }
        else {
          fVar13 = (1.0 - fVar20) * -2.0 * (1.0 - fVar13) + 1.0;
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x58);
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        if (fVar17 <= 0.5) {
          fVar17 = (fVar20 + fVar20) * fVar17;
        }
        else {
          fVar17 = (1.0 - fVar20) * -2.0 * (1.0 - fVar17) + 1.0;
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        if (fVar14 <= 0.5) {
          fVar14 = (fVar20 + fVar20) * fVar14;
        }
        else {
          fVar14 = (1.0 - fVar20) * -2.0 * (1.0 - fVar14) + 1.0;
        }
        fVar20 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar13 * fVar20 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar17 * fVar20 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar14 * fVar20 + fVar15;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_DARKEN:
    lVar6 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8)
        ;
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8)
        ;
        uVar9 = -(uint)(fVar13 <= fVar17);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6)
        ;
        fVar12 = (float)uVar2;
        fVar15 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6)
        ;
        fVar16 = (float)uVar2;
        fVar19 = (float)((ulong)uVar2 >> 0x20);
        uVar10 = -(uint)(fVar12 <= fVar16);
        uVar11 = -(uint)(fVar15 <= fVar19);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar20 * (float)(~uVar11 & (uint)fVar19 | (uint)fVar15 & uVar11) +
                      (float)((ulong)uVar2 >> 0x20),
                      fVar20 * (float)(~uVar10 & (uint)fVar16 | (uint)fVar12 & uVar10) +
                      (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             (float)(~uVar9 & (uint)fVar17 | (uint)fVar13 & uVar9) * fVar20 + fVar14;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x2100);
    break;
  case BLENDEQUATION_ADVANCED_LIGHTEN:
    lVar6 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8)
        ;
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8)
        ;
        uVar9 = -(uint)(fVar17 <= fVar13);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6)
        ;
        fVar12 = (float)uVar2;
        fVar15 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6)
        ;
        fVar16 = (float)uVar2;
        fVar19 = (float)((ulong)uVar2 >> 0x20);
        uVar10 = -(uint)(fVar16 <= fVar12);
        uVar11 = -(uint)(fVar19 <= fVar15);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar20 * (float)(~uVar11 & (uint)fVar19 | (uint)fVar15 & uVar11) +
                      (float)((ulong)uVar2 >> 0x20),
                      fVar20 * (float)(~uVar10 & (uint)fVar16 | (uint)fVar12 & uVar10) +
                      (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             (float)(~uVar9 & (uint)fVar17 | (uint)fVar13 & uVar9) * fVar20 + fVar14;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x2100);
    break;
  case BLENDEQUATION_ADVANCED_COLORDODGE:
    lVar6 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        fVar13 = 0.0;
        if (0.0 < fVar20) {
          fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x5c);
          fVar13 = 1.0;
          if (fVar17 < 1.0) {
            fVar20 = fVar20 / (1.0 - fVar17);
            fVar13 = 1.0;
            if (fVar20 <= 1.0) {
              fVar13 = fVar20;
            }
          }
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        fVar17 = 0.0;
        if ((0.0 < fVar20) &&
           (fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                               lVar6 + -0x58), fVar17 = 1.0, fVar14 < 1.0)) {
          fVar20 = fVar20 / (1.0 - fVar14);
          fVar17 = 1.0;
          if (fVar20 <= 1.0) {
            fVar17 = fVar20;
          }
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        fVar14 = 0.0;
        if (0.0 < fVar20) {
          fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x54);
          fVar14 = 1.0;
          if (fVar12 < 1.0) {
            fVar20 = fVar20 / (1.0 - fVar12);
            fVar14 = 1.0;
            if (fVar20 <= 1.0) {
              fVar14 = fVar20;
            }
          }
        }
        fVar20 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar13 * fVar20 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar17 * fVar20 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar14 * fVar20 + fVar15;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_COLORBURN:
    lVar6 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        fVar13 = 1.0;
        if (fVar20 < 1.0) {
          fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x5c);
          fVar13 = 0.0;
          if (0.0 < fVar17) {
            fVar17 = (1.0 - fVar20) / fVar17;
            fVar13 = 1.0;
            if (fVar17 <= 1.0) {
              fVar13 = fVar17;
            }
            fVar13 = 1.0 - fVar13;
          }
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        fVar17 = 1.0;
        if (fVar20 < 1.0) {
          fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x58);
          fVar17 = 0.0;
          if (0.0 < fVar14) {
            fVar14 = (1.0 - fVar20) / fVar14;
            fVar17 = 1.0;
            if (fVar14 <= 1.0) {
              fVar17 = fVar14;
            }
            fVar17 = 1.0 - fVar17;
          }
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        fVar14 = 1.0;
        if (fVar20 < 1.0) {
          fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x54);
          fVar14 = 0.0;
          if (0.0 < fVar12) {
            fVar12 = (1.0 - fVar20) / fVar12;
            fVar14 = 1.0;
            if (fVar12 <= 1.0) {
              fVar14 = fVar12;
            }
            fVar14 = 1.0 - fVar14;
          }
        }
        fVar20 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar13 * fVar20 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar17 * fVar20 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar14 * fVar20 + fVar15;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_HARDLIGHT:
    lVar6 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x5c);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        if (fVar20 <= 0.5) {
          fVar13 = (fVar20 + fVar20) * fVar13;
        }
        else {
          fVar13 = (1.0 - fVar20) * -2.0 * (1.0 - fVar13) + 1.0;
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x58);
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        if (fVar20 <= 0.5) {
          fVar17 = (fVar20 + fVar20) * fVar17;
        }
        else {
          fVar17 = (1.0 - fVar20) * -2.0 * (1.0 - fVar17) + 1.0;
        }
        fVar20 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        if (fVar20 <= 0.5) {
          fVar14 = (fVar20 + fVar20) * fVar14;
        }
        else {
          fVar14 = (1.0 - fVar20) * -2.0 * (1.0 - fVar14) + 1.0;
        }
        fVar20 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar13 * fVar20 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar17 * fVar20 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar14 * fVar20 + fVar15;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_SOFTLIGHT:
    lVar6 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar20 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x5c);
        local_78 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x3c);
        if (fVar13 <= 0.5) {
          local_78 = local_78 - (1.0 - (fVar13 + fVar13)) * local_78 * (1.0 - local_78);
        }
        else {
          local_74 = fVar13 + fVar13 + -1.0;
          if (local_78 <= 0.25) {
            local_78 = ((local_78 * 16.0 + -12.0) * local_78 + 3.0) * local_74 * local_78 + local_78
            ;
          }
          else {
            if (local_78 < 0.0) {
              fVar13 = sqrtf(local_78);
            }
            else {
              fVar13 = SQRT(local_78);
            }
            local_78 = local_74 * (fVar13 - local_78) + local_78;
          }
        }
        local_74 = local_78 * fVar20 +
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x2c);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x58);
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        if (fVar13 <= 0.5) {
          fVar17 = fVar17 - (1.0 - (fVar13 + fVar13)) * fVar17 * (1.0 - fVar17);
        }
        else {
          local_78 = fVar13 + fVar13 + -1.0;
          if (fVar17 <= 0.25) {
            fVar17 = ((fVar17 * 16.0 + -12.0) * fVar17 + 3.0) * local_78 * fVar17 + fVar17;
          }
          else {
            if (fVar17 < 0.0) {
              local_44 = fVar17;
              fVar13 = sqrtf(fVar17);
              fVar17 = local_44;
            }
            else {
              fVar13 = SQRT(fVar17);
            }
            fVar17 = local_78 * (fVar13 - fVar17) + fVar17;
          }
        }
        local_78 = fVar17 * fVar20 +
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x28);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        if (fVar13 <= 0.5) {
          fVar17 = fVar17 - (1.0 - (fVar13 + fVar13)) * fVar17 * (1.0 - fVar17);
        }
        else {
          fVar13 = fVar13 + fVar13 + -1.0;
          if (fVar17 <= 0.25) {
            fVar17 = ((fVar17 * 16.0 + -12.0) * fVar17 + 3.0) * fVar13 * fVar17 + fVar17;
          }
          else {
            if (fVar17 < 0.0) {
              local_44 = fVar13;
              local_34 = fVar17;
              fVar14 = sqrtf(fVar17);
              fVar13 = local_44;
              fVar17 = local_34;
            }
            else {
              fVar14 = SQRT(fVar17);
            }
            fVar17 = fVar13 * (fVar14 - fVar17) + fVar17;
          }
        }
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             local_74;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             local_78;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar17 * fVar20 + fVar13;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_DIFFERENCE:
    lVar6 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4);
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8)
                 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + 8);
        fVar13 = -fVar17;
        if (-fVar17 <= fVar17) {
          fVar13 = fVar17;
        }
        fVar17 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6)
        ;
        uVar4 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6)
        ;
        auVar21._0_4_ = (float)uVar4 - (float)uVar2;
        auVar21._4_4_ = (float)((ulong)uVar4 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
        auVar21._8_8_ = 0;
        uVar5 = CONCAT44(auVar21._4_4_,auVar21._0_4_);
        auVar18._0_8_ = uVar5 ^ 0x8000000080000000;
        auVar18._8_4_ = 0x80000000;
        auVar18._12_4_ = 0x80000000;
        auVar18 = maxps(auVar18,auVar21);
        pfVar1 = (float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar20 * auVar18._4_4_ + pfVar1[1],fVar20 * auVar18._0_4_ + *pfVar1);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             fVar13 * fVar20 + fVar17;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x2100);
    break;
  case BLENDEQUATION_ADVANCED_EXCLUSION:
    lVar6 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        fVar20 = *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8)
        ;
        fVar17 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8)
        ;
        fVar14 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6)
        ;
        uVar4 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6)
        ;
        fVar12 = (float)uVar2;
        fVar15 = (float)((ulong)uVar2 >> 0x20);
        fVar16 = (float)uVar4;
        fVar19 = (float)((ulong)uVar4 >> 0x20);
        uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar20 * (fVar15 * -2.0 * fVar19 + fVar15 + fVar19) +
                      (float)((ulong)uVar2 >> 0x20),
                      fVar20 * (fVar12 * -2.0 * fVar16 + fVar12 + fVar16) + (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             (fVar13 * -2.0 * fVar17 + fVar13 + fVar17) * fVar20 + fVar14;
      }
      lVar6 = lVar6 + 0x84;
    } while (lVar6 != 0x2100);
    break;
  case BLENDEQUATION_ADVANCED_HSL_HUE:
    pVVar8 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0;
    do {
      if (this->m_sampleRegister[lVar6].isAlive == true) {
        local_50.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data[2];
        local_50.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data;
        local_60.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data[2];
        local_60.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data;
        fVar20 = this->m_sampleRegister[lVar6].blendSrcFactorA;
        advblend::setLumSat(local_40,&local_50,&local_60,&local_60);
        local_70[2] = 0.0;
        local_70[0] = 0.0;
        local_70[1] = 0.0;
        lVar7 = 0;
        do {
          local_70[lVar7] = *(float *)(local_40 + lVar7 * 4) * fVar20;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_80 = 0.0;
        local_88 = 0;
        lVar7 = 0;
        do {
          *(float *)((long)&local_88 + lVar7 * 4) = local_70[lVar7] + pVVar8->m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        this->m_sampleRegister[lVar6].blendedRGB.m_data[2] = local_80;
        *(undefined8 *)this->m_sampleRegister[lVar6].blendedRGB.m_data = local_88;
      }
      lVar6 = lVar6 + 1;
      pVVar8 = pVVar8 + 0xb;
    } while (lVar6 != 0x40);
    break;
  case BLENDEQUATION_ADVANCED_HSL_SATURATION:
    pVVar8 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0;
    do {
      if (this->m_sampleRegister[lVar6].isAlive == true) {
        local_50.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data[2];
        local_50.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data;
        local_60.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data[2];
        local_60.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data;
        fVar20 = this->m_sampleRegister[lVar6].blendSrcFactorA;
        advblend::setLumSat(local_40,&local_60,&local_50,&local_60);
        local_70[2] = 0.0;
        local_70[0] = 0.0;
        local_70[1] = 0.0;
        lVar7 = 0;
        do {
          local_70[lVar7] = *(float *)(local_40 + lVar7 * 4) * fVar20;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_80 = 0.0;
        local_88 = 0;
        lVar7 = 0;
        do {
          *(float *)((long)&local_88 + lVar7 * 4) = local_70[lVar7] + pVVar8->m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        this->m_sampleRegister[lVar6].blendedRGB.m_data[2] = local_80;
        *(undefined8 *)this->m_sampleRegister[lVar6].blendedRGB.m_data = local_88;
      }
      lVar6 = lVar6 + 1;
      pVVar8 = pVVar8 + 0xb;
    } while (lVar6 != 0x40);
    break;
  case BLENDEQUATION_ADVANCED_HSL_COLOR:
    pVVar8 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0;
    do {
      if (this->m_sampleRegister[lVar6].isAlive == true) {
        local_50.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data[2];
        local_50.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data;
        local_60.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data[2];
        local_60.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data;
        fVar20 = this->m_sampleRegister[lVar6].blendSrcFactorA;
        advblend::setLum(&local_50,&local_60);
        local_70[2] = 0.0;
        local_70[0] = 0.0;
        local_70[1] = 0.0;
        lVar7 = 0;
        do {
          local_70[lVar7] = *(float *)(local_40 + lVar7 * 4) * fVar20;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_80 = 0.0;
        local_88 = 0;
        lVar7 = 0;
        do {
          *(float *)((long)&local_88 + lVar7 * 4) = local_70[lVar7] + pVVar8->m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        this->m_sampleRegister[lVar6].blendedRGB.m_data[2] = local_80;
        *(undefined8 *)this->m_sampleRegister[lVar6].blendedRGB.m_data = local_88;
      }
      lVar6 = lVar6 + 1;
      pVVar8 = pVVar8 + 0xb;
    } while (lVar6 != 0x40);
    break;
  case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:
    pVVar8 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0;
    do {
      if (this->m_sampleRegister[lVar6].isAlive == true) {
        local_50.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data[2];
        local_50.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendSrcColor.m_data;
        local_60.m_data[2] = this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data[2];
        local_60.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar6].clampedBlendDstColor.m_data;
        fVar20 = this->m_sampleRegister[lVar6].blendSrcFactorA;
        advblend::setLum(&local_60,&local_50);
        local_70[2] = 0.0;
        local_70[0] = 0.0;
        local_70[1] = 0.0;
        lVar7 = 0;
        do {
          local_70[lVar7] = *(float *)(local_40 + lVar7 * 4) * fVar20;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_80 = 0.0;
        local_88 = 0;
        lVar7 = 0;
        do {
          *(float *)((long)&local_88 + lVar7 * 4) = local_70[lVar7] + pVVar8->m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        this->m_sampleRegister[lVar6].blendedRGB.m_data[2] = local_80;
        *(undefined8 *)this->m_sampleRegister[lVar6].blendedRGB.m_data = local_88;
      }
      lVar6 = lVar6 + 1;
      pVVar8 = pVVar8 + 0xb;
    } while (lVar6 != 0x40);
  }
  return;
}

Assistant:

void FragmentProcessor::executeAdvancedBlend (BlendEquationAdvanced equation)
{
	using namespace advblend;

#define SAMPLE_REGISTER_ADV_BLEND(FUNCTION_NAME)											\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;							\
			const Vec4&	dstColor	= sample.clampedBlendDstColor;							\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
			const float	r			= FUNCTION_NAME(srcColor[0], dstColor[0])*p0 + bias[0];	\
			const float	g			= FUNCTION_NAME(srcColor[1], dstColor[1])*p0 + bias[1];	\
			const float	b			= FUNCTION_NAME(srcColor[2], dstColor[2])*p0 + bias[2];	\
																							\
			sample.blendedRGB = Vec3(r, g, b);												\
		}																					\
	}

#define SAMPLE_REGISTER_ADV_BLEND_HSL(COLOR_EXPRESSION)										\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec3	srcColor	= sample.clampedBlendSrcColor.swizzle(0,1,2);			\
			const Vec3	dstColor	= sample.clampedBlendDstColor.swizzle(0,1,2);			\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
																							\
			sample.blendedRGB = (COLOR_EXPRESSION)*p0 + bias;								\
		}																					\
	}

	// Pre-compute factors & compute alpha \todo [2014-03-18 pyry] Re-using variable names.
	// \note clampedBlend*Color contains clamped & unpremultiplied colors
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			SampleData&	sample		= m_sampleRegister[regSampleNdx];
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;
			const Vec4&	dstColor	= sample.clampedBlendDstColor;
			const float	srcA		= srcColor.w();
			const float	dstA		= dstColor.w();
			const float	p0			= srcA*dstA;
			const float p1			= srcA*(1.0f-dstA);
			const float p2			= dstA*(1.0f-srcA);
			const Vec3	bias		(srcColor[0]*p1 + dstColor[0]*p2,
									 srcColor[1]*p1 + dstColor[1]*p2,
									 srcColor[2]*p1 + dstColor[2]*p2);

			sample.blendSrcFactorRGB	= bias;
			sample.blendSrcFactorA		= p0;
			sample.blendedA				= p0 + p1 + p2;
		}
	}

	switch (equation)
	{
		case BLENDEQUATION_ADVANCED_MULTIPLY:		SAMPLE_REGISTER_ADV_BLEND(multiply);									break;
		case BLENDEQUATION_ADVANCED_SCREEN:			SAMPLE_REGISTER_ADV_BLEND(screen);										break;
		case BLENDEQUATION_ADVANCED_OVERLAY:		SAMPLE_REGISTER_ADV_BLEND(overlay);										break;
		case BLENDEQUATION_ADVANCED_DARKEN:			SAMPLE_REGISTER_ADV_BLEND(darken);										break;
		case BLENDEQUATION_ADVANCED_LIGHTEN:		SAMPLE_REGISTER_ADV_BLEND(lighten);										break;
		case BLENDEQUATION_ADVANCED_COLORDODGE:		SAMPLE_REGISTER_ADV_BLEND(colordodge);									break;
		case BLENDEQUATION_ADVANCED_COLORBURN:		SAMPLE_REGISTER_ADV_BLEND(colorburn);									break;
		case BLENDEQUATION_ADVANCED_HARDLIGHT:		SAMPLE_REGISTER_ADV_BLEND(hardlight);									break;
		case BLENDEQUATION_ADVANCED_SOFTLIGHT:		SAMPLE_REGISTER_ADV_BLEND(softlight);									break;
		case BLENDEQUATION_ADVANCED_DIFFERENCE:		SAMPLE_REGISTER_ADV_BLEND(difference);									break;
		case BLENDEQUATION_ADVANCED_EXCLUSION:		SAMPLE_REGISTER_ADV_BLEND(exclusion);									break;
		case BLENDEQUATION_ADVANCED_HSL_HUE:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(srcColor, dstColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_SATURATION:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(dstColor, srcColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_COLOR:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(srcColor, dstColor));				break;
		case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(dstColor, srcColor));				break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_ADV_BLEND
#undef SAMPLE_REGISTER_ADV_BLEND_HSL
}